

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall ISMSnoop::ISMSnoop(ISMSnoop *this,ISMSnoopLib *lib)

{
  function<void_(ISMSnoopInstrument_*)> *pfVar1;
  function<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)> *pfVar2;
  function<void_(ISMSnoopInstrument_*,_char_*)> *pfVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  function<void_(ISMSnoopInstrument_*,_char_*,_int_*)> *pfVar6;
  element_type *peVar7;
  void *pvVar8;
  long lVar9;
  undefined1 local_308 [8];
  ResultBuilder __catchResult;
  SourceLineInfo local_58;
  
  peVar7 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar5 = &__catchResult.m_assertionInfo.macroName._M_string_length;
  local_308 = (undefined1  [8])psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"ismsnoop_open","");
  pvVar8 = peVar7->library_;
  if (pvVar8 == (void *)0x0) {
    (this->open).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->open)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(this->open).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->open).super__Function_base._M_functor + 8) = 0;
  }
  else {
    lVar9 = dlsym(pvVar8,local_308);
    *(undefined8 *)&(this->open).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->open).super__Function_base._M_functor + 8) = 0;
    (this->open).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->open)._M_invoker = (_Invoker_type)0x0;
    if (lVar9 != 0) {
      *(long *)&(this->open).super__Function_base._M_functor = lVar9;
      (this->open)._M_invoker =
           std::
           _Function_handler<ISMSnoopInstrument_*(const_char_*),_ISMSnoopInstrument_*(*)(const_char_*)>
           ::_M_invoke;
      (this->open).super__Function_base._M_manager =
           std::
           _Function_handler<ISMSnoopInstrument_*(const_char_*),_ISMSnoopInstrument_*(*)(const_char_*)>
           ::_M_manager;
    }
  }
  if (local_308 != (undefined1  [8])psVar5) {
    operator_delete((void *)local_308);
  }
  peVar7 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_308 = (undefined1  [8])psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"ismsnoop_close","");
  pfVar1 = &this->close;
  pvVar8 = peVar7->library_;
  if (pvVar8 == (void *)0x0) {
    (this->close).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->close)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(pfVar1->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(this->close).super__Function_base._M_functor + 8) = 0;
  }
  else {
    lVar9 = dlsym(pvVar8,local_308);
    *(undefined8 *)&(pfVar1->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(this->close).super__Function_base._M_functor + 8) = 0;
    (this->close).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->close)._M_invoker = (_Invoker_type)0x0;
    if (lVar9 != 0) {
      *(long *)&(this->close).super__Function_base._M_functor = lVar9;
      (this->close)._M_invoker =
           std::_Function_handler<void_(ISMSnoopInstrument_*),_void_(*)(ISMSnoopInstrument_*)>::
           _M_invoke;
      (this->close).super__Function_base._M_manager =
           std::_Function_handler<void_(ISMSnoopInstrument_*),_void_(*)(ISMSnoopInstrument_*)>::
           _M_manager;
    }
  }
  if (local_308 != (undefined1  [8])psVar5) {
    operator_delete((void *)local_308);
  }
  peVar7 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_308 = (undefined1  [8])psVar5;
  __catchResult._664_8_ = pfVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,"ismsnoop_get_panel_icon_size","");
  pfVar2 = &this->get_panel_icon_size;
  pvVar8 = peVar7->library_;
  if (pvVar8 == (void *)0x0) {
    (this->get_panel_icon_size).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->get_panel_icon_size)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(pfVar2->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(this->get_panel_icon_size).super__Function_base._M_functor + 8) = 0;
  }
  else {
    lVar9 = dlsym(pvVar8,local_308);
    *(undefined8 *)&(pfVar2->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(this->get_panel_icon_size).super__Function_base._M_functor + 8) = 0;
    (this->get_panel_icon_size).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->get_panel_icon_size)._M_invoker = (_Invoker_type)0x0;
    if (lVar9 != 0) {
      *(long *)&(this->get_panel_icon_size).super__Function_base._M_functor = lVar9;
      (this->get_panel_icon_size)._M_invoker =
           std::
           _Function_handler<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*),_void_(*)(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>
           ::_M_invoke;
      (this->get_panel_icon_size).super__Function_base._M_manager =
           std::
           _Function_handler<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*),_void_(*)(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>
           ::_M_manager;
    }
  }
  if (local_308 != (undefined1  [8])psVar5) {
    operator_delete((void *)local_308);
  }
  peVar7 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_308 = (undefined1  [8])psVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,"ismsnoop_get_panel_icon_bytes","");
  pfVar3 = &this->get_panel_icon_bytes;
  pvVar8 = peVar7->library_;
  if (pvVar8 == (void *)0x0) {
    (this->get_panel_icon_bytes).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->get_panel_icon_bytes)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(pfVar3->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(this->get_panel_icon_bytes).super__Function_base._M_functor + 8) = 0;
  }
  else {
    lVar9 = dlsym(pvVar8,local_308);
    *(undefined8 *)&(pfVar3->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(this->get_panel_icon_bytes).super__Function_base._M_functor + 8) = 0;
    (this->get_panel_icon_bytes).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->get_panel_icon_bytes)._M_invoker = (_Invoker_type)0x0;
    if (lVar9 != 0) {
      *(long *)&(this->get_panel_icon_bytes).super__Function_base._M_functor = lVar9;
      (this->get_panel_icon_bytes)._M_invoker =
           std::
           _Function_handler<void_(ISMSnoopInstrument_*,_char_*),_void_(*)(ISMSnoopInstrument_*,_char_*)>
           ::_M_invoke;
      (this->get_panel_icon_bytes).super__Function_base._M_manager =
           std::
           _Function_handler<void_(ISMSnoopInstrument_*,_char_*),_void_(*)(ISMSnoopInstrument_*,_char_*)>
           ::_M_manager;
    }
  }
  if (local_308 != (undefined1  [8])psVar5) {
    operator_delete((void *)local_308);
  }
  peVar7 = (lib->lib).super___shared_ptr<rtw::DynamicLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_308 = (undefined1  [8])psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"ismsnoop_get_name","");
  pfVar6 = &this->get_name;
  pvVar8 = peVar7->library_;
  if (pvVar8 == (void *)0x0) {
    (this->get_name).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->get_name)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(pfVar6->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(this->get_name).super__Function_base._M_functor + 8) = 0;
  }
  else {
    lVar9 = dlsym(pvVar8,local_308);
    *(undefined8 *)&(pfVar6->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(this->get_name).super__Function_base._M_functor + 8) = 0;
    (this->get_name).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->get_name)._M_invoker = (_Invoker_type)0x0;
    if (lVar9 != 0) {
      *(long *)&(this->get_name).super__Function_base._M_functor = lVar9;
      (this->get_name)._M_invoker =
           std::
           _Function_handler<void_(ISMSnoopInstrument_*,_char_*,_int_*),_void_(*)(ISMSnoopInstrument_*,_char_*,_int_*)>
           ::_M_invoke;
      (this->get_name).super__Function_base._M_manager =
           std::
           _Function_handler<void_(ISMSnoopInstrument_*,_char_*,_int_*),_void_(*)(ISMSnoopInstrument_*,_char_*,_int_*)>
           ::_M_manager;
    }
  }
  if (local_308 != (undefined1  [8])psVar5) {
    operator_delete((void *)local_308);
  }
  paVar4 = &local_58.file.field_2;
  local_58.file._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,"");
  local_58.line = 0x2e;
  Catch::ResultBuilder::ResultBuilder((ResultBuilder *)local_308,"REQUIRE",&local_58,"open",Normal);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar4) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  local_58.file._M_string_length = (size_type)this;
  Catch::ExpressionLhs<const_std::function<ISMSnoopInstrument_*(const_char_*)>_&>::endExpression
            ((ExpressionLhs<const_std::function<ISMSnoopInstrument_*(const_char_*)>_&> *)&local_58);
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  local_58.file._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,"");
  local_58.line = 0x2f;
  Catch::ResultBuilder::ResultBuilder((ResultBuilder *)local_308,"REQUIRE",&local_58,"close",Normal)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar4) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  local_58.file._M_string_length._0_1_ = __catchResult.m_shouldDebugBreak;
  local_58.file._M_string_length._1_1_ = __catchResult.m_shouldThrow;
  local_58.file._M_string_length._2_6_ = __catchResult._666_6_;
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*)>_&>::endExpression
            ((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*)>_&> *)&local_58);
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  local_58.file._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,"");
  local_58.line = 0x30;
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_308,"REQUIRE",&local_58,"get_panel_icon_size",Normal);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar4) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  local_58.file._M_string_length = (size_type)pfVar2;
  Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>_&>::
  endExpression((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_int_*,_int_*,_int_*)>_&>
                 *)&local_58);
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  local_58.file._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,"");
  local_58.line = 0x31;
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_308,"REQUIRE",&local_58,"get_panel_icon_bytes",Normal);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar4) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  local_58.file._M_string_length = (size_type)pfVar3;
  Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*)>_&>::endExpression
            ((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*)>_&> *)&local_58)
  ;
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  local_58.file._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
             ,"");
  local_58.line = 0x32;
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_308,"REQUIRE",&local_58,"get_name",Normal);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar4) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  local_58.file._M_dataplus._M_p = (pointer)local_308;
  local_58.file._M_string_length = (size_type)pfVar6;
  Catch::ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>_&>::
  endExpression((ExpressionLhs<const_std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>_&> *)
                &local_58);
  Catch::ResultBuilder::react((ResultBuilder *)local_308);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_308);
  return;
}

Assistant:

ISMSnoop::ISMSnoop(const ISMSnoopLib & lib)
	: open(lib.lib->get_function<Sig_ismsnoop_open>("ismsnoop_open"))
	, close(lib.lib->get_function<Sig_ismsnoop_close>("ismsnoop_close"))
	, get_panel_icon_size(lib.lib->get_function<Sig_ismsnoop_get_panel_icon_size>("ismsnoop_get_panel_icon_size"))
	, get_panel_icon_bytes(lib.lib->get_function<Sig_ismsnoop_get_panel_icon_bytes>("ismsnoop_get_panel_icon_bytes"))
	, get_name(lib.lib->get_function<Sig_ismsnoop_get_name>("ismsnoop_get_name"))
{
	REQUIRE(open);
	REQUIRE(close);
	REQUIRE(get_panel_icon_size);
	REQUIRE(get_panel_icon_bytes);
	REQUIRE(get_name);
}